

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ApprovalMismatchException::ApprovalMismatchException
          (ApprovalMismatchException *this,string *received,string *approved)

{
  undefined8 *in_RDI;
  string *in_stack_00000188;
  string *in_stack_00000190;
  ApprovalMismatchException *in_stack_00000198;
  string *in_stack_ffffffffffffffb8;
  ApprovalException *in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  *in_RDI = &PTR__ApprovalMismatchException_0028c7d0;
  format(in_stack_00000198,in_stack_00000190,in_stack_00000188);
  ApprovalException::ApprovalException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ::std::__cxx11::string::~string(local_38);
  *in_RDI = &PTR__ApprovalMismatchException_0028c7d0;
  return;
}

Assistant:

ApprovalMismatchException::ApprovalMismatchException(const std::string& received,
                                                         const std::string& approved)
        : ApprovalException(format(received, approved))
    {
    }